

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O1

char * crn_get_scale_mode_desc(crn_scale_mode sm)

{
  if (sm < cCRNSMTotal) {
    return &DAT_001a8f98 + *(int *)(&DAT_001a8f98 + (ulong)sm * 4);
  }
  return "?";
}

Assistant:

const char* crn_get_scale_mode_desc(crn_scale_mode sm)
{
    switch (sm)
    {
    case cCRNSMDisabled:
        return "disabled";
    case cCRNSMAbsolute:
        return "absolute";
    case cCRNSMRelative:
        return "relative";
    case cCRNSMLowerPow2:
        return "lowerpow2";
    case cCRNSMNearestPow2:
        return "nearestpow2";
    case cCRNSMNextPow2:
        return "nextpow2";
    default:
        break;
    }
    return "?";
}